

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O1

void dlib::cpu::mish(tensor *dest,tensor *src)

{
  float __x;
  long lVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar5;
  undefined1 auVar6 [64];
  undefined1 extraout_var_01 [60];
  
  iVar3 = (*dest->_vptr_tensor[4])();
  iVar4 = (*src->_vptr_tensor[2])(src);
  lVar1 = src->m_size;
  if (lVar1 != 0) {
    lVar5 = 0;
    do {
      __x = *(float *)(CONCAT44(extraout_var_00,iVar4) + lVar5 * 4);
      auVar6._0_4_ = expf(__x);
      auVar6._4_60_ = extraout_var_01;
      auVar2 = vfmadd231ss_fma(ZEXT416((uint)(auVar6._0_4_ * auVar6._0_4_)),
                               SUB6416(ZEXT464(0x40000000),0),auVar6._0_16_);
      *(float *)(CONCAT44(extraout_var,iVar3) + lVar5 * 4) =
           __x - (__x + __x) / (auVar2._0_4_ + 2.0);
      lVar5 = lVar5 + 1;
    } while (lVar1 != lVar5);
  }
  return;
}

Assistant:

void mish (
            tensor& dest,
            const tensor& src
        )
        {
            const auto d = dest.host_write_only();
            const auto s = src.host();
            for (size_t i = 0; i < src.size(); ++i)
            {
                const auto e = std::exp(s[i]);
                const auto delta = 2*e + e*e + 2;
                d[i] = s[i] - 2*s[i]/delta;
            }
        }